

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR yang_parse_submodule
                 (lysp_yang_ctx **context,ly_ctx *ly_ctx,lysp_ctx *main_ctx,ly_in *in,
                 lysp_submodule **submod)

{
  ly_set *plVar1;
  undefined4 in_EAX;
  int iVar2;
  LY_ERR LVar3;
  lysp_yang_ctx *plVar4;
  lysp_submodule *submod_00;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  ly_ctx *plVar8;
  undefined1 auVar9 [16];
  ly_stmt kw;
  size_t word_len;
  char *word;
  ly_stmt local_64;
  undefined1 local_60 [24];
  anon_union_8_3_0df1e6ad_for_ly_set_2 local_48;
  size_t local_40;
  char *local_38;
  
  local_60._8_16_ = (undefined1  [16])0x0;
  local_48.dnodes = (lyd_node **)0x0;
  auVar9._0_4_ = -(uint)(context == (lysp_yang_ctx **)0x0);
  auVar9._4_4_ = -(uint)(ly_ctx == (ly_ctx *)0x0);
  auVar9._8_4_ = -(uint)(main_ctx == (lysp_ctx *)0x0);
  auVar9._12_4_ = -(uint)(in == (ly_in *)0x0);
  iVar2 = movmskps(in_EAX,auVar9);
  local_60._0_8_ = ly_ctx;
  if ((iVar2 != 0) || (submod == (lysp_submodule **)0x0)) {
    __assert_fail("context && ly_ctx && main_ctx && in && submod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                  ,0x1297,
                  "LY_ERR yang_parse_submodule(struct lysp_yang_ctx **, struct ly_ctx *, struct lysp_ctx *, struct ly_in *, struct lysp_submodule **)"
                 );
  }
  plVar4 = (lysp_yang_ctx *)calloc(1,0x60);
  *context = plVar4;
  if (plVar4 == (lysp_yang_ctx *)0x0) {
    ly_log(ly_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_submodule");
    return LY_EMEM;
  }
  plVar4->format = LYS_IN_YANG;
  plVar4->in = in;
  plVar4->main_ctx = main_ctx;
  submod_00 = (lysp_submodule *)calloc(1,0xb8);
  if (submod_00 == (lysp_submodule *)0x0) {
    LVar3 = LY_EMEM;
    ly_log(ly_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_submodule");
  }
  else {
    plVar1 = main_ctx->parsed_mods;
    submod_00->mod = *(lys_module **)(plVar1->field_2).dnodes[plVar1->count - 1];
    submod_00->field_0x79 = 1;
    plVar4->parsed_mods = plVar1;
    ly_set_add(plVar1,submod_00,'\x01',(uint32_t *)0x0);
    ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,in);
    LVar3 = skip_redundant_chars(*context);
    if ((LVar3 == LY_SUCCESS) &&
       (LVar3 = get_keyword(*context,&local_64,&local_38,&local_40), LVar3 == LY_SUCCESS)) {
      if (local_64 == LY_STMT_SUBMODULE) {
        LVar3 = parse_submodule(*context,submod_00);
        if ((LVar3 != LY_SUCCESS) || (LVar3 = skip_redundant_chars(*context), LVar3 != LY_SUCCESS))
        goto LAB_0017dc13;
        pcVar5 = in->current;
        if (*pcVar5 == '\0') {
          submod_00->field_0x79 = submod_00->field_0x79 & 0xfe;
          *submod = submod_00;
          ly_log_location_revert(0,0,0,1);
          return LY_SUCCESS;
        }
        if (*context == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar1 = (*context)->parsed_mods;
          plVar8 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
        }
        sVar6 = strlen(pcVar5);
        pcVar7 = "";
        if (0xf < sVar6) {
          pcVar7 = "...";
        }
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX,
                "Trailing garbage \"%.*s%s\" after submodule, expected end-of-input.",0xf,pcVar5,
                pcVar7);
      }
      else {
        if (local_64 == LY_STMT_MODULE) {
          ly_log(ly_ctx,LY_LLERR,LY_EDENIED,
                 "Input data contains module in situation when a submodule is expected.");
          LVar3 = LY_EINVAL;
          goto LAB_0017dc13;
        }
        if (*context == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar1 = (*context)->parsed_mods;
          plVar8 = (ly_ctx *)**(undefined8 **)(plVar1->field_2).dnodes[plVar1->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(local_64);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX,
                "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar5);
      }
      LVar3 = LY_EVALID;
    }
  }
LAB_0017dc13:
  ly_log_location_revert(0,0,0,1);
  lysp_module_free((lysf_ctx *)local_60,(lysp_module *)submod_00);
  lysp_yang_ctx_free(*context);
  *context = (lysp_yang_ctx *)0x0;
  return LVar3;
}

Assistant:

LY_ERR
yang_parse_submodule(struct lysp_yang_ctx **context, struct ly_ctx *ly_ctx, struct lysp_ctx *main_ctx,
        struct ly_in *in, struct lysp_submodule **submod)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_submodule *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = ly_ctx};

    assert(context && ly_ctx && main_ctx && in && submod);

    /* create context */
    *context = calloc(1, sizeof **context);
    LY_CHECK_ERR_RET(!(*context), LOGMEM(ly_ctx), LY_EMEM);
    (*context)->format = LYS_IN_YANG;
    (*context)->in = in;
    (*context)->main_ctx = main_ctx;

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(ly_ctx); ret = LY_EMEM, cleanup);
    mod_p->mod = PARSER_CUR_PMOD(main_ctx)->mod;
    mod_p->parsing = 1;

    /* use main context parsed mods adding the current one */
    (*context)->parsed_mods = main_ctx->parsed_mods;
    ly_set_add((*context)->parsed_mods, mod_p, 1, NULL);

    ly_log_location(NULL, NULL, NULL, in);

    /* skip redundant but valid characters at the beginning */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);

    /* "module"/"submodule" */
    ret = get_keyword(*context, &kw, &word, &word_len);
    LY_CHECK_GOTO(ret, cleanup);

    if (kw == LY_STMT_MODULE) {
        LOGERR(ly_ctx, LY_EDENIED, "Input data contains module in situation when a submodule is expected.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_SUBMODULE) {
        LOGVAL_PARSER(*context, LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* substatements */
    ret = parse_submodule(*context, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip redundant but valid characters at the end */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);
    if (in->current[0]) {
        LOGVAL_PARSER(*context, LY_VCODE_TRAILING_SUBMOD, 15, in->current, strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod_p->parsing = 0;
    *submod = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, (struct lysp_module *)mod_p);
        lysp_yang_ctx_free(*context);
        *context = NULL;
    }

    return ret;
}